

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
::load(list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
       *this,handle src,bool convert)

{
  vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
  *this_00;
  bool bVar1;
  bool bVar2;
  itype *__x;
  long lVar3;
  sequence_iterator sVar4;
  sequence s;
  reference it;
  value_conv conv;
  handle local_90;
  vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
  *local_88;
  handle local_80;
  PyObject *local_78;
  long local_70;
  PyObject *local_60;
  long local_58;
  object local_50;
  type_caster_generic local_48;
  
  local_88 = &this->value;
  bVar1 = sequence::check_(src);
  if ((bVar1) &&
     ((src.m_ptr == (PyObject *)0x0 || (((src.m_ptr)->ob_type->tp_flags & 0x18000000) == 0)))) {
    local_90.m_ptr = src.m_ptr;
    handle::inc_ref(&local_90);
    this_00 = local_88;
    std::
    vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
    ::clear(local_88);
    reserve_maybe<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_0>
              ((list_caster<std::vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>,_asd::Frame<short,_asd::container::vec>_>
                *)this_00,(sequence *)&local_90,this_00);
    local_78 = local_90.m_ptr;
    sVar4 = sequence::end((sequence *)&local_90);
    local_70 = sVar4.super_sequence_slow_readwrite.index;
    for (lVar3 = 0; bVar1 = local_70 == lVar3, !bVar1; lVar3 = lVar3 + 1) {
      local_60 = local_78;
      local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_58 = lVar3;
      type_caster_base<asd::Frame<short,_asd::container::vec>_>::type_caster_base
                ((type_caster_base<asd::Frame<short,_asd::container::vec>_> *)&local_48);
      accessor::operator_cast_to_object((accessor *)&local_80);
      bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        (&local_48,local_80,convert);
      object::~object((object *)&local_80);
      if (!bVar2) {
        object::~object(&local_50);
        break;
      }
      __x = detail::type_caster_base::operator_cast_to_Frame_((type_caster_base *)&local_48);
      std::
      vector<asd::Frame<short,_asd::container::vec>,_std::allocator<asd::Frame<short,_asd::container::vec>_>_>
      ::push_back(local_88,__x);
      object::~object(&local_50);
    }
    object::~object((object *)&local_90);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src)) {
            return false;
        }
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert)) {
                return false;
            }
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }